

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O0

void __thiscall DStrobe::Tick(DStrobe *this)

{
  int iVar1;
  DStrobe *this_local;
  
  iVar1 = this->m_Count + -1;
  this->m_Count = iVar1;
  if (iVar1 == 0) {
    if ((int)((this->super_DLighting).super_DSectorEffect.m_Sector)->lightlevel == this->m_MinLight)
    {
      sector_t::SetLightLevel
                ((sector_t *)(this->super_DLighting).super_DSectorEffect.m_Sector,this->m_MaxLight);
      this->m_Count = this->m_BrightTime;
    }
    else {
      sector_t::SetLightLevel
                ((sector_t *)(this->super_DLighting).super_DSectorEffect.m_Sector,this->m_MinLight);
      this->m_Count = this->m_DarkTime;
    }
  }
  return;
}

Assistant:

void DStrobe::Tick ()
{
	if (--m_Count == 0)
	{
		if (m_Sector->lightlevel == m_MinLight)
		{
			m_Sector->SetLightLevel(m_MaxLight);
			m_Count = m_BrightTime;
		}
		else
		{
			m_Sector->SetLightLevel(m_MinLight);
			m_Count = m_DarkTime;
		}
	}
}